

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall
Rml::DataViewAttribute::DataViewAttribute
          (DataViewAttribute *this,Element *element,String *override_attribute,int sort_offset)

{
  String local_48;
  int local_24;
  String *pSStack_20;
  int sort_offset_local;
  String *override_attribute_local;
  Element *element_local;
  DataViewAttribute *this_local;
  
  local_24 = sort_offset;
  pSStack_20 = override_attribute;
  override_attribute_local = (String *)element;
  element_local = (Element *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)override_attribute);
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_48,local_24);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewAttribute_00815448;
  return;
}

Assistant:

DataViewAttribute::DataViewAttribute(Element* element, String override_attribute, int sort_offset) :
	DataViewCommon(element, std::move(override_attribute), sort_offset)
{}